

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall QTableWidget::insertRow(QTableWidget *this,int row)

{
  long lVar1;
  long *plVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = (long *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  (**(code **)(*plVar2 + 0xf8))(plVar2,row,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::insertRow(int row)
{
    Q_D(QTableWidget);
    d->tableModel()->insertRows(row);
}